

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

ParsedInternalKey * __thiscall
leveldb::ParsedInternalKey::DebugString_abi_cxx11_(ParsedInternalKey *this)

{
  ostream *poVar1;
  long in_RSI;
  Slice local_1e0 [2];
  Slice local_1c0;
  leveldb local_1b0 [32];
  ostringstream local_190 [8];
  ostringstream ss;
  ParsedInternalKey *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,'\'');
  Slice::ToString_abi_cxx11_(local_1e0);
  Slice::Slice(&local_1c0,(string *)local_1e0);
  EscapeString_abi_cxx11_(local_1b0,&local_1c0);
  poVar1 = std::operator<<(poVar1,(string *)local_1b0);
  poVar1 = std::operator<<(poVar1,"\' @ ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x10));
  poVar1 = std::operator<<(poVar1," : ");
  std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x18));
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
  std::ostringstream ss;
  ss << '\'' << EscapeString(user_key.ToString()) << "' @ " << sequence << " : "
     << static_cast<int>(type);
  return ss.str();
}